

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyColors<cRGBA,cBGRA,bModulate>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  BYTE BVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  EBlend EVar6;
  FSpecialColormap *pFVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  BYTE *pBVar15;
  
  pFVar7 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_00594952_caseD_0:
    if (count < 1) {
      count = 0;
    }
    pBVar15 = pin + 3;
    for (lVar13 = 0; count != (int)lVar13; lVar13 = lVar13 + 1) {
      BVar1 = *pBVar15;
      if (BVar1 != '\0') {
        pout[lVar13 * 4 + 2] = (BYTE)(((uint)pout[lVar13 * 4 + 2] * (uint)pBVar15[-3]) / 0xff);
        pout[lVar13 * 4 + 1] = (BYTE)(((uint)pout[lVar13 * 4 + 1] * (uint)pBVar15[-2]) / 0xff);
        pout[lVar13 * 4] = (BYTE)(((uint)pout[lVar13 * 4] * (uint)pBVar15[-1]) / 0xff);
        pout[lVar13 * 4 + 3] = BVar1;
      }
      pBVar15 = pBVar15 + step;
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_00594952_caseD_0;
    case BLEND_ICEMAP:
      if (count < 1) {
        count = 0;
      }
      for (lVar13 = 0; count != (int)lVar13; lVar13 = lVar13 + 1) {
        BVar1 = pin[3];
        if (BVar1 != '\0') {
          iVar9 = cRGBA::Gray(pin);
          iVar9 = iVar9 >> 4;
          pout[lVar13 * 4 + 2] =
               (BYTE)(((uint)pout[lVar13 * 4 + 2] * (uint)IcePalette[iVar9][0]) / 0xff);
          pout[lVar13 * 4 + 1] =
               (BYTE)(((uint)pout[lVar13 * 4 + 1] * (uint)IcePalette[iVar9][1]) / 0xff);
          pout[lVar13 * 4] = (BYTE)(((uint)pout[lVar13 * 4] * (uint)IcePalette[iVar9][2]) / 0xff);
          pout[lVar13 * 4 + 3] = BVar1;
        }
        pin = pin + step;
      }
      break;
    case BLEND_OVERLAY:
      if (count < 1) {
        count = 0;
      }
      pBVar15 = pin + 3;
      for (lVar13 = 0; count != (int)lVar13; lVar13 = lVar13 + 1) {
        BVar1 = *pBVar15;
        if (BVar1 != '\0') {
          iVar9 = inf->blendcolor[3];
          bVar2 = pBVar15[-2];
          iVar10 = inf->blendcolor[1];
          bVar3 = pBVar15[-1];
          iVar5 = inf->blendcolor[2];
          pout[lVar13 * 4 + 2] =
               (BYTE)(((uint)pout[lVar13 * 4 + 2] *
                      ((uint)pBVar15[-3] * iVar9 + inf->blendcolor[0] >> 0x10 & 0xff)) / 0xff);
          pout[lVar13 * 4 + 1] =
               (BYTE)(((uint)pout[lVar13 * 4 + 1] * ((uint)bVar2 * iVar9 + iVar10 >> 0x10 & 0xff)) /
                     0xff);
          pout[lVar13 * 4] =
               (BYTE)(((uint)pout[lVar13 * 4] * ((uint)bVar3 * iVar9 + iVar5 >> 0x10 & 0xff)) / 0xff
                     );
          pout[lVar13 * 4 + 3] = BVar1;
        }
        pBVar15 = pBVar15 + step;
      }
      break;
    case BLEND_MODULATE:
      if (count < 1) {
        count = 0;
      }
      pBVar15 = pin + 3;
      for (lVar13 = 0; count != (int)lVar13; lVar13 = lVar13 + 1) {
        BVar1 = *pBVar15;
        if (BVar1 != '\0') {
          bVar2 = pBVar15[-2];
          iVar9 = inf->blendcolor[1];
          bVar3 = pBVar15[-1];
          iVar10 = inf->blendcolor[2];
          pout[lVar13 * 4 + 2] =
               (BYTE)(((uint)pout[lVar13 * 4 + 2] *
                      ((uint)pBVar15[-3] * inf->blendcolor[0] >> 0x10 & 0xff)) / 0xff);
          pout[lVar13 * 4 + 1] =
               (BYTE)(((uint)pout[lVar13 * 4 + 1] * ((uint)bVar2 * iVar9 >> 0x10 & 0xff)) / 0xff);
          pout[lVar13 * 4] =
               (BYTE)(((uint)pout[lVar13 * 4] * ((uint)bVar3 * iVar10 >> 0x10 & 0xff)) / 0xff);
          pout[lVar13 * 4 + 3] = BVar1;
        }
        pBVar15 = pBVar15 + step;
      }
      break;
    default:
      EVar6 = inf->blend;
      lVar13 = (long)EVar6;
      if (lVar13 < 0x21) {
        if (BLEND_ICEMAP < EVar6) {
          iVar9 = 0x20 - EVar6;
          if (count < 1) {
            count = 0;
          }
          for (lVar13 = 0; count != (int)lVar13; lVar13 = lVar13 + 1) {
            bVar2 = pin[3];
            if (bVar2 != 0) {
              iVar10 = cRGBA::Gray(pin);
              iVar10 = iVar10 * (EVar6 + BLEND_MODULATE);
              bVar3 = pin[1];
              bVar4 = pin[2];
              pout[lVar13 * 4 + 2] =
                   (BYTE)(((uint)pout[lVar13 * 4 + 2] *
                          ((int)((uint)*pin * iVar9 + iVar10) / 0x1f & 0xffU)) / 0xff);
              pout[lVar13 * 4 + 1] =
                   (BYTE)(((uint)pout[lVar13 * 4 + 1] *
                          ((int)((uint)bVar3 * iVar9 + iVar10) / 0x1f & 0xffU)) / 0xff);
              pout[lVar13 * 4] =
                   (BYTE)(((uint)pout[lVar13 * 4] *
                          ((int)((uint)bVar4 * iVar9 + iVar10) / 0x1f & 0xffU)) / 0xff);
              pout[lVar13 * 4 + 3] = bVar2;
            }
            pin = pin + step;
          }
        }
      }
      else {
        if (count < 1) {
          count = 0;
        }
        for (lVar14 = 0; count != (int)lVar14; lVar14 = lVar14 + 1) {
          BVar1 = pin[3];
          if (BVar1 != '\0') {
            uVar8 = cRGBA::Gray(pin);
            uVar11 = 0xff;
            if (uVar8 < 0xff) {
              uVar11 = uVar8;
            }
            if ((int)uVar8 < 1) {
              uVar11 = 0;
            }
            uVar12 = (ulong)uVar11;
            bVar2 = *(byte *)((long)pFVar7 + uVar12 * 4 + lVar13 * 0x518 + -0xa700);
            bVar3 = *(byte *)((long)pFVar7 + uVar12 * 4 + lVar13 * 0x518 + -0xa6ff);
            pout[lVar14 * 4 + 2] =
                 (BYTE)(((uint)pout[lVar14 * 4 + 2] *
                        (uint)*(byte *)((long)pFVar7 + uVar12 * 4 + lVar13 * 0x518 + -0xa6fe)) /
                       0xff);
            pout[lVar14 * 4 + 1] = (BYTE)(((uint)pout[lVar14 * 4 + 1] * (uint)bVar3) / 0xff);
            pout[lVar14 * 4] = (BYTE)(((uint)pout[lVar14 * 4] * (uint)bVar2) / 0xff);
            pout[lVar14 * 4 + 3] = BVar1;
          }
          pin = pin + step;
        }
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}